

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_CheckLocalView
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  AActor *this;
  bool bVar5;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042d744;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        pPVar3 = (this->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (this->super_DThinker).super_DObject.Class = pPVar3;
        }
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042d744;
        }
        goto LAB_0042d6e8;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_0042d734;
    this = (AActor *)0x0;
LAB_0042d6e8:
    if (numparam == 1) {
      pcVar4 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        bVar5 = AActor::CheckLocalView(this,param[1].field_0.i);
        if (numret < 1) {
          iVar2 = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x53f,
                          "int AF_AActor_CheckLocalView(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (ret->RegType != '\0') {
            __assert_fail("RegType == REGT_INT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                          ,0x13f,"void VMReturn::SetInt(int)");
          }
          *(uint *)ret->Location = (uint)bVar5;
          iVar2 = 1;
        }
        return iVar2;
      }
      pcVar4 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x53e,
                  "int AF_AActor_CheckLocalView(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0042d734:
  pcVar4 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0042d744:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x53d,
                "int AF_AActor_CheckLocalView(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckLocalView)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(cp);
	ACTION_RETURN_BOOL(self->CheckLocalView(cp));
}